

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int check8(aint val)

{
  bool bVar1;
  char buffer [64];
  
  bVar1 = 0xfffffdff < val - 0x100U;
  if (!bVar1) {
    snprintf(buffer,0x40,"value 0x%X is truncated to 8bit value: 0x%02X",(ulong)(uint)val,
             (ulong)(uint)val & 0xff);
    Warning(buffer,(char *)0x0,W_PASS3);
  }
  return (uint)bVar1;
}

Assistant:

int check8(aint val) {
	if (val < -256 || val > 255) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 8bit value: 0x%02X", val, val&0xFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}